

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_file.c
# Opt level: O2

err_t cmdFileValNotExist(int count,char **names)

{
  bool_t bVar1;
  int iVar2;
  uint uVar3;
  file_t file;
  err_t eVar4;
  long lVar5;
  
  lVar5 = 0;
  do {
    if (count == (int)lVar5) goto LAB_001043d6;
    file = fileOpen(names[lVar5],"rb");
    lVar5 = lVar5 + 1;
  } while (file == (file_t)0x0);
  bVar1 = fileClose(file);
  if (bVar1 == 0) {
    eVar4 = 0x67;
  }
  else {
    iVar2 = printf("Some files already exist. Overwrite [y/n]?");
    eVar4 = 0xcc;
    if (-1 < iVar2) {
      do {
        uVar3 = cmdTermGetch();
        if ((uVar3 - 0x4e < 0x2c) && ((0x80100000801U >> ((ulong)(uVar3 - 0x4e) & 0x3f) & 1) != 0))
        break;
      } while (uVar3 != 10);
      putchar(10);
      if (uVar3 != 10 && (uVar3 & 0x5f) != 0x4e) {
LAB_001043d6:
        eVar4 = 0;
      }
    }
  }
  return eVar4;
}

Assistant:

err_t cmdFileValNotExist(int count, char* names[])
{
	err_t code;
	file_t file;
	int ch;
	for (; count--; names++)
	{
		ASSERT(strIsValid(*names));
		code = cmdFileOpen(file, *names, "rb");
		if (code == ERR_OK)
		{
			code = cmdFileClose(file);
			ERR_CALL_CHECK(code);
			if (printf("Some files already exist. Overwrite [y/n]?") < 0)
				return ERR_FILE_EXISTS;
			do
				ch = cmdTermGetch();
			while (ch != 'Y' && ch != 'y' && ch != 'N' && ch != 'n' && ch != '\n');
			printf("\n");
			if (ch == 'N' || ch == 'n' || ch == '\n')
				return ERR_FILE_EXISTS;
			break;
		}
	}
	return ERR_OK;
}